

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::internal::MatcherBase<const_std::tuple<solitaire::piles::PileId,_unsigned_int>_&>::
~MatcherBase(MatcherBase<const_std::tuple<solitaire::piles::PileId,_unsigned_int>_&> *this)

{
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }